

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void MallocBlock::CheckForCorruptedBuffer
               (MallocBlockQueueEntry *queue_entry,size_t buffer_idx,uchar *buffer,
               size_t size_of_buffer)

{
  size_t sVar1;
  int iVar2;
  void *pvVar3;
  void *extraout_RDX;
  FunctionRef<void_(bool)> body;
  anon_class_8_1_efb29e24 local_58;
  ThreadCachePtr *local_50;
  _func_void_bool_void_ptr *local_48;
  undefined8 local_40;
  size_t size;
  MallocBlock *b;
  size_t sStack_28;
  int i;
  size_t size_of_buffer_local;
  uchar *buffer_local;
  size_t buffer_idx_local;
  MallocBlockQueueEntry *queue_entry_local;
  
  sStack_28 = size_of_buffer;
  size_of_buffer_local = (size_t)buffer;
  buffer_local = (uchar *)buffer_idx;
  buffer_idx_local = (size_t)queue_entry;
  iVar2 = memcmp(buffer,kMagicDeletedBuffer,size_of_buffer);
  if (iVar2 != 0) {
    RAW_LOG(-3,
            "Found a corrupted memory buffer in MallocBlock (may be offset from user ptr): buffer index: %zd, buffer ptr: %p, size of buffer: %zd"
            ,buffer_local,size_of_buffer_local,sStack_28);
    if (sStack_28 < 0x401) {
      for (b._4_4_ = 0; (ulong)(long)(int)b._4_4_ < sStack_28; b._4_4_ = b._4_4_ + 1) {
        if (*(char *)(size_of_buffer_local + (long)(int)b._4_4_) != -0x33) {
          RAW_LOG(-3,"Buffer byte %d is 0x%02x (should be 0x%02x).",(ulong)b._4_4_,
                  (ulong)*(byte *)(size_of_buffer_local + (long)(int)b._4_4_),0xcd);
        }
      }
    }
    else {
      RAW_LOG(-3,"Buffer too large to print corruption.");
    }
    size = *(size_t *)buffer_idx_local;
    local_40 = *(undefined8 *)(buffer_idx_local + 8);
    if (*(int *)(buffer_idx_local + 0x90) < 1) {
      RAW_LOG(-3,
              "Skipping the printing of the deleter\'s stack!  Its stack was not found; either the corruption occurred too early in execution to obtain a stack trace or --max_free_queue_size was set to 0."
             );
    }
    else {
      TracePrintf(2,"Deleted by thread %zx\n",*(undefined8 *)(buffer_idx_local + 0x98));
      local_58.queue_entry = (MallocBlockQueueEntry *)buffer_idx_local;
      tcmalloc::FunctionRef<void(bool)>::
      FunctionRef<MallocBlock::CheckForCorruptedBuffer(MallocBlockQueueEntry_const&,unsigned_long,unsigned_char_const*,unsigned_long)::_lambda(bool)_1_,void>
                ((FunctionRef<void(bool)> *)&local_50,&local_58);
      body.data = extraout_RDX;
      body.fn = local_48;
      tcmalloc::ThreadCachePtr::WithStacktraceScope(local_50,body);
    }
    sVar1 = size;
    pvVar3 = data_addr((MallocBlock *)size);
    RAW_LOG(-4,
            "Memory was written to after being freed.  MallocBlock: %p, user ptr: %p, size: %zd.  If you can\'t find the source of the error, try using ASan (https://github.com/google/sanitizers), Valgrind, or Purify, or study the output of the deleter\'s stack printed above."
            ,sVar1,pvVar3,local_40);
  }
  return;
}

Assistant:

static void CheckForCorruptedBuffer(const MallocBlockQueueEntry& queue_entry,
                                      size_t buffer_idx,
                                      const unsigned char* buffer,
                                      size_t size_of_buffer) {
    if (memcmp(buffer, kMagicDeletedBuffer, size_of_buffer) == 0) {
      return;
    }

    RAW_LOG(ERROR,
            "Found a corrupted memory buffer in MallocBlock (may be offset "
            "from user ptr): buffer index: %zd, buffer ptr: %p, size of "
            "buffer: %zd", buffer_idx, buffer, size_of_buffer);

    // The magic deleted buffer should only be 1024 bytes, but in case
    // this changes, let's put an upper limit on the number of debug
    // lines we'll output:
    if (size_of_buffer <= 1024) {
      for (int i = 0; i < size_of_buffer; ++i) {
        if (buffer[i] != kMagicDeletedByte) {
          RAW_LOG(ERROR, "Buffer byte %d is 0x%02x (should be 0x%02x).",
                  i, buffer[i], kMagicDeletedByte);
        }
      }
    } else {
      RAW_LOG(ERROR, "Buffer too large to print corruption.");
    }

    const MallocBlock* b = queue_entry.block;
    const size_t size = queue_entry.size;
    if (queue_entry.num_deleter_pcs > 0) {
      TracePrintf(STDERR_FILENO, "Deleted by thread %zx\n",
                  queue_entry.deleter_threadid);

      ThreadCachePtr::WithStacktraceScope([&] (bool stacktrace_allowed) {
        tcmalloc::DumpStackTraceToStderr(queue_entry.deleter_pcs, queue_entry.num_deleter_pcs,
                                         FLAGS_symbolize_stacktrace,
                                         "    @ ");
      });
    } else {
      RAW_LOG(ERROR,
              "Skipping the printing of the deleter's stack!  Its stack was "
              "not found; either the corruption occurred too early in "
              "execution to obtain a stack trace or --max_free_queue_size was "
              "set to 0.");
    }

    RAW_LOG(FATAL,
            "Memory was written to after being freed.  MallocBlock: %p, user "
            "ptr: %p, size: %zd.  If you can't find the source of the error, "
            "try using ASan (https://github.com/google/sanitizers), "
            "Valgrind, or Purify, or study the "
            "output of the deleter's stack printed above.",
            b, b->data_addr(), size);
  }